

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_87eea::GeneratedCode_DeepCloneMessageWithUnknowns_Test::TestBody
          (GeneratedCode_DeepCloneMessageWithUnknowns_Test *this)

{
  bool bVar1;
  upb_Arena *arena;
  upb_Arena *arena_00;
  protobuf_test_messages_proto2_TestAllTypesProto2 *msg;
  protobuf_test_messages_proto2_UnknownToTestAllTypes *msg_00;
  upb_Arena *puVar2;
  upb_Arena *arena_01;
  upb_Message *msg_01;
  size_type *this_00;
  char *pcVar3;
  char *in_R9;
  upb_StringView key;
  upb_StringView val;
  upb_StringView unknown;
  AssertionResult gtest_ar_1;
  string unknown_data;
  AssertHelper local_78;
  Message local_70;
  string cloned_unknown_data;
  char *data;
  size_t len;
  upb_EncodeStatus status;
  uintptr_t iter;
  
  arena = upb_Arena_New();
  arena_00 = upb_Arena_New();
  msg = protobuf_test_messages_proto2_TestAllTypesProto2_new(arena);
  bVar1 = protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_double_set
                    (msg,0xc,1200.5,arena);
  cloned_unknown_data._M_dataplus._M_p._0_1_ = bVar1;
  cloned_unknown_data._M_string_length = 0;
  if (bVar1) {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&cloned_unknown_data._M_string_length);
    key = upb_StringView_FromString("key1");
    val = upb_StringView_FromString("value1");
    puVar2 = arena;
    bVar1 = protobuf_test_messages_proto2_TestAllTypesProto2_map_string_string_set
                      (msg,key,val,arena);
    cloned_unknown_data._M_dataplus._M_p._0_1_ = bVar1;
    cloned_unknown_data._M_string_length = 0;
    if (bVar1) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&cloned_unknown_data._M_string_length);
      msg_00 = protobuf_test_messages_proto2_UnknownToTestAllTypes_new(arena_00);
      protobuf_test_messages_proto2_UnknownToTestAllTypes_set_optional_bool(msg_00,true);
      protobuf_test_messages_proto2_UnknownToTestAllTypes_set_optional_int32(msg_00,0x7b);
      puVar2 = upb_Arena_New();
      status = upb_Encode(&msg_00->base_dont_copy_me__upb_internal_use_only,
                          &protobuf_0test_0messages__proto2__UnknownToTestAllTypes_msg_init,4,puVar2
                          ,&data,&len);
      cloned_unknown_data._M_dataplus._M_p =
           cloned_unknown_data._M_dataplus._M_p & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<upb_EncodeStatus,upb_EncodeStatus>
                ((internal *)&unknown_data,"status","kUpb_EncodeStatus_Ok",&status,
                 (upb_EncodeStatus *)&cloned_unknown_data);
      if ((char)unknown_data._M_dataplus._M_p != '\0') {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&unknown_data._M_string_length);
        unknown_data._M_dataplus._M_p = (pointer)&unknown_data.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&unknown_data,data,data + len);
        _upb_Message_AddUnknown_dont_copy_me__upb_internal_use_only
                  (&msg->base_dont_copy_me__upb_internal_use_only,data,len,arena,false);
        arena_01 = upb_Arena_New();
        msg_01 = upb_Message_DeepClone
                           (&msg->base_dont_copy_me__upb_internal_use_only,
                            &protobuf_0test_0messages__proto2__TestAllTypesProto2_msg_init,arena_01)
        ;
        upb_Arena_Free(arena);
        upb_Arena_Free(arena_00);
        upb_Arena_Free(puVar2);
        cloned_unknown_data._M_dataplus._M_p = (pointer)&cloned_unknown_data.field_2;
        cloned_unknown_data._M_string_length = 0;
        iter = 0;
        cloned_unknown_data.field_2._M_local_buf[0] = '\0';
        while (bVar1 = upb_Message_NextUnknown(msg_01,&unknown,&iter), bVar1) {
          std::__cxx11::string::append((char *)&cloned_unknown_data,(ulong)unknown.data);
        }
        testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                  ((internal *)&gtest_ar_1,"unknown_data","cloned_unknown_data",&unknown_data,
                   &cloned_unknown_data);
        if (gtest_ar_1.success_ == false) {
          testing::Message::Message(&local_70);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar_1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar3 = "";
          }
          else {
            pcVar3 = *(char **)gtest_ar_1.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_78,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy_test.cc"
                     ,0x17c,pcVar3);
          testing::internal::AssertHelper::operator=(&local_78,&local_70);
          testing::internal::AssertHelper::~AssertHelper(&local_78);
          if (local_70.ss_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
              (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
               )0x0) {
            (**(code **)(*(long *)local_70.ss_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_1.message_);
        upb_Arena_Free(arena_01);
        std::__cxx11::string::~string((string *)&cloned_unknown_data);
        std::__cxx11::string::~string((string *)&unknown_data);
        return;
      }
      testing::Message::Message((Message *)&cloned_unknown_data);
      if (unknown_data._M_string_length == 0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)unknown_data._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&unknown,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy_test.cc"
                 ,0x166,pcVar3);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&unknown,(Message *)&cloned_unknown_data);
      this_00 = &unknown_data._M_string_length;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&unknown);
      if (cloned_unknown_data._M_dataplus._M_p != (pointer)0x0) {
        (**(code **)(*(long *)cloned_unknown_data._M_dataplus._M_p + 8))();
      }
      goto LAB_00157267;
    }
    testing::Message::Message((Message *)&unknown);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&unknown_data,(internal *)&cloned_unknown_data,
               (AssertionResult *)
               "protobuf_test_messages_proto2_TestAllTypesProto2_map_string_string_set( msg, upb_StringView_FromString(\"key1\"), upb_StringView_FromString(\"value1\"), source_arena)"
               ,"false","true",(char *)puVar2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy_test.cc"
               ,0x156,unknown_data._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&unknown);
  }
  else {
    testing::Message::Message((Message *)&unknown);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&unknown_data,(internal *)&cloned_unknown_data,
               (AssertionResult *)
               "protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_double_set( msg, 12, 1200.5, source_arena)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy_test.cc"
               ,0x152,unknown_data._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&unknown);
  }
  this_00 = &cloned_unknown_data._M_string_length;
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
  std::__cxx11::string::~string((string *)&unknown_data);
  if (unknown.data != (char *)0x0) {
    (**(code **)(*(long *)unknown.data + 8))();
  }
LAB_00157267:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_00);
  return;
}

Assistant:

TEST(GeneratedCode, DeepCloneMessageWithUnknowns) {
  upb_Arena* source_arena = upb_Arena_New();
  upb_Arena* unknown_arena = upb_Arena_New();
  protobuf_test_messages_proto2_TestAllTypesProto2* msg =
      protobuf_test_messages_proto2_TestAllTypesProto2_new(source_arena);
  ASSERT_TRUE(
      protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_double_set(
          msg, 12, 1200.5, source_arena));
  ASSERT_TRUE(
      protobuf_test_messages_proto2_TestAllTypesProto2_map_string_string_set(
          msg, upb_StringView_FromString("key1"),
          upb_StringView_FromString("value1"), source_arena));
  // Create unknown data.
  protobuf_test_messages_proto2_UnknownToTestAllTypes* unknown_source =
      protobuf_test_messages_proto2_UnknownToTestAllTypes_new(unknown_arena);
  protobuf_test_messages_proto2_UnknownToTestAllTypes_set_optional_bool(
      unknown_source, true);
  protobuf_test_messages_proto2_UnknownToTestAllTypes_set_optional_int32(
      unknown_source, 123);
  // Encode unknown message to bytes.
  size_t len;
  char* data;
  upb_Arena* encode_arena = upb_Arena_New();
  upb_EncodeStatus status = upb_Encode(
      UPB_UPCAST(unknown_source),
      &protobuf_0test_0messages__proto2__UnknownToTestAllTypes_msg_init,
      kUpb_EncodeOption_CheckRequired, encode_arena, &data, &len);
  ASSERT_EQ(status, kUpb_EncodeStatus_Ok);
  std::string unknown_data(data, len);
  // Add unknown data.
  UPB_PRIVATE(_upb_Message_AddUnknown)
  (UPB_UPCAST(msg), data, len, source_arena, false);
  // Create clone.
  upb_Arena* clone_arena = upb_Arena_New();
  protobuf_test_messages_proto2_TestAllTypesProto2* clone =
      (protobuf_test_messages_proto2_TestAllTypesProto2*)upb_Message_DeepClone(
          UPB_UPCAST(msg),
          &protobuf_0test_0messages__proto2__TestAllTypesProto2_msg_init,
          clone_arena);
  upb_Arena_Free(source_arena);
  upb_Arena_Free(unknown_arena);
  upb_Arena_Free(encode_arena);
  // Read unknown data from clone and verify.
  std::string cloned_unknown_data;
  upb_StringView unknown;
  uintptr_t iter = kUpb_Message_UnknownBegin;
  while (upb_Message_NextUnknown(UPB_UPCAST(clone), &unknown, &iter)) {
    cloned_unknown_data.append(unknown.data, unknown.size);
  }
  EXPECT_EQ(unknown_data, cloned_unknown_data);
  upb_Arena_Free(clone_arena);
}